

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

bool __thiscall
UdpSocketImpl::AddToMulticastGroup
          (UdpSocketImpl *this,char *szMulticastIp,char *szInterfaceIp,uint32_t nInterfaceIndex)

{
  int iVar1;
  int *piVar2;
  undefined1 local_60 [4];
  undefined1 auStack_5c [4];
  ip_mreq mreq_1;
  ipv6_mreq mreq;
  uint32_t loop;
  uint32_t hops;
  int iAddFamily;
  addrinfo *lstAddr;
  char *pcStack_28;
  uint32_t nInterfaceIndex_local;
  char *szInterfaceIp_local;
  char *szMulticastIp_local;
  UdpSocketImpl *this_local;
  
  lstAddr._4_4_ = nInterfaceIndex;
  pcStack_28 = szInterfaceIp;
  szInterfaceIp_local = szMulticastIp;
  szMulticastIp_local = (char *)this;
  iVar1 = getaddrinfo(szMulticastIp,(char *)0x0,(addrinfo *)0x0,(addrinfo **)&hops);
  if (iVar1 == 0) {
    iVar1 = _hops->ai_family;
    freeaddrinfo(_hops);
    mreq.ipv6mr_interface = 0xff;
    mreq.ipv6mr_multiaddr.__in6_u.__u6_addr32[3] = 1;
    if (iVar1 == 10) {
      memset(&mreq_1,0,0x14);
      inet_pton(10,szInterfaceIp_local,&mreq_1);
      mreq.ipv6mr_multiaddr.__in6_u.__u6_addr32[2] = lstAddr._4_4_;
      iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x14,&mreq_1,0x14);
      if (((iVar1 != 0) ||
          (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x12,&mreq.ipv6mr_interface,
                              4), iVar1 != 0)) ||
         ((iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x13,
                              (void *)((long)&mreq.ipv6mr_multiaddr.__in6_u + 0xc),4), iVar1 != 0 ||
          (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0x29,0x11,
                              (void *)((long)&mreq.ipv6mr_multiaddr.__in6_u + 8),4), iVar1 != 0))))
      {
        piVar2 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar2;
        (this->super_BaseSocketImpl).m_iErrLoc = 2;
        return false;
      }
    }
    else {
      memset(local_60,0,8);
      inet_pton(2,szInterfaceIp_local,local_60);
      inet_pton(2,pcStack_28,auStack_5c);
      iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x23,local_60,8);
      if ((((iVar1 != 0) ||
           (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x21,&mreq.ipv6mr_interface,4)
           , iVar1 != 0)) ||
          (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x22,
                              (void *)((long)&mreq.ipv6mr_multiaddr.__in6_u + 0xc),4), iVar1 != 0))
         || (iVar1 = setsockopt((this->super_BaseSocketImpl).m_fSock,0,0x20,auStack_5c,4),
            iVar1 != 0)) {
        piVar2 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar2;
        (this->super_BaseSocketImpl).m_iErrLoc = 2;
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool UdpSocketImpl::AddToMulticastGroup(const char* const szMulticastIp, const char* const szInterfaceIp, uint32_t nInterfaceIndex) noexcept
#endif
{
    struct addrinfo *lstAddr;
    if (::getaddrinfo(szMulticastIp, nullptr, nullptr, &lstAddr) != 0)
        return false;
    const int iAddFamily = lstAddr->ai_family;
    ::freeaddrinfo(lstAddr);

    constexpr uint32_t hops = static_cast<uint8_t>('\xff');
    constexpr uint32_t loop = 1;

    if (iAddFamily == AF_INET6)
    {
        ipv6_mreq mreq{IN6ADDR_ANY_INIT, 0};
        inet_pton(AF_INET6, szMulticastIp, &mreq.ipv6mr_multiaddr);
        mreq.ipv6mr_interface = nInterfaceIndex;

        // http://www.tldp.org/HOWTO/Multicast-HOWTO-6.html
        if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_ADD_MEMBERSHIP, reinterpret_cast<char*>(&mreq), sizeof(mreq)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_MULTICAST_HOPS, reinterpret_cast<const char*>(&hops), sizeof(hops)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_MULTICAST_LOOP, reinterpret_cast<const char*>(&loop), sizeof(loop)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_MULTICAST_IF, reinterpret_cast<char*>(&mreq.ipv6mr_interface), sizeof(mreq.ipv6mr_interface)) != 0)
        {
            m_iError = WSAGetLastError();
            m_iErrLoc = 2;
            return false;
        }
    }
    else
    {
        ip_mreq mreq{{0},{0}};
        inet_pton(AF_INET, szMulticastIp, &mreq.imr_multiaddr.s_addr);
#if defined(_WIN32) || defined(_WIN64)
        mreq.imr_interface.s_addr = htonl(nInterfaceIndex);
#else
        inet_pton(AF_INET, szInterfaceIp, &mreq.imr_interface.s_addr);
#endif

        if (::setsockopt(m_fSock, IPPROTO_IP, IP_ADD_MEMBERSHIP, reinterpret_cast<char*>(&mreq), sizeof(mreq)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IP, IP_MULTICAST_TTL, reinterpret_cast<const char*>(&hops), sizeof(hops)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IP, IP_MULTICAST_LOOP, reinterpret_cast<const char*>(&loop), sizeof(loop)) != 0
        || ::setsockopt(m_fSock, IPPROTO_IP, IP_MULTICAST_IF, reinterpret_cast<char*>(&mreq.imr_interface), sizeof(mreq.imr_interface)) != 0)
        {
            m_iError = WSAGetLastError();
            m_iErrLoc = 2;
            return false;
        }
    }

    return true;
}